

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_.cpp
# Opt level: O0

ostream * operator<<(ostream *os,vector_<char> *vector)

{
  type pcVar1;
  ostream *poVar2;
  int local_1c;
  int i;
  vector_<char> *vector_local;
  ostream *os_local;
  
  for (local_1c = 0; (ulong)(long)local_1c < vector->_size; local_1c = local_1c + 1) {
    pcVar1 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                       (&vector->arr,(long)local_1c);
    poVar2 = std::operator<<(os,*pcVar1);
    std::operator<<(poVar2," ");
  }
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const vector_ &vector) {
        for (int i = 0; i < vector._size; i++) {
            os << vector.arr[i] << " ";
        }
        return os;
    }